

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O3

void __thiscall
viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *this,size_type num)

{
  pointer prVar1;
  rt_expression_interface<double> *prVar2;
  rt_expression_interface<double> *prVar3;
  size_type sVar4;
  allocator_type local_31;
  
  (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00116560;
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::vector(&this->
            super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ,num,&local_31);
  (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_vector_expr_00116608;
  if (num != 0) {
    sVar4 = 0;
    do {
      prVar1 = (this->
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ).
               super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      prVar3 = (rt_expression_interface<double> *)operator_new(0x10);
      prVar3->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_001167a0;
      prVar3[1]._vptr_rt_expression_interface = (_func_int **)0x0;
      prVar2 = prVar1[sVar4].rt_expr_._M_ptr;
      if (prVar2 != prVar3) {
        if (prVar2 != (rt_expression_interface<double> *)0x0) {
          (*prVar2->_vptr_rt_expression_interface[1])();
        }
        prVar1[sVar4].rt_expr_._M_ptr = prVar3;
      }
      sVar4 = sVar4 + 1;
    } while (num != sVar4);
  }
  return;
}

Assistant:

explicit rt_vector_expr(size_type num) : BaseType(num)
      {
        //initialize all zeros:
        for (std::size_t i=0; i<num; ++i)
          BaseType::operator[](i) = viennamath::rt_constant<numeric_type, interface_type>(0);
      }